

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

void make_sick(long xtime,char *cause,boolean talk,int type)

{
  uint uVar1;
  boolean bVar2;
  byte bVar3;
  char *pcVar4;
  long old;
  int type_local;
  boolean talk_local;
  char *cause_local;
  long xtime_local;
  
  uVar1 = u.uprops[0x1d].intrinsic;
  if (xtime < 1) {
    if ((u.uprops[0x1d].intrinsic != 0) && ((type & (uint)(u._971_1_ & 3)) != 0)) {
      bVar3 = u._971_1_ & 3 & ((byte)type ^ 0xff);
      u._971_1_ = u._971_1_ & 0xfc | bVar3;
      if (bVar3 == 0) {
        if (talk != '\0') {
          pline("What a relief!");
        }
        u.uprops[0x1d].intrinsic = 0;
      }
      else {
        if (talk != '\0') {
          pline("You feel somewhat better.");
        }
        set_itimeout(&u.uprops[0x1d].intrinsic,(ulong)(u.uprops[0x1d].intrinsic << 1));
      }
      iflags.botl = '\x01';
    }
  }
  else {
    if (u.uprops[0x34].intrinsic != 0) {
      return;
    }
    if ((youmonst.data)->mlet == ' ') {
      return;
    }
    if (youmonst.data == mons + 0xfd) {
      return;
    }
    bVar2 = defends(0x21,uwep);
    if (bVar2 != '\0') {
      return;
    }
    if (uVar1 == 0) {
      pline("You feel deathly sick.");
    }
    else if (talk != '\0') {
      pcVar4 = "even";
      if (xtime <= (long)((ulong)u.uprops[0x1d].intrinsic / 2)) {
        pcVar4 = "much";
      }
      pline("You feel %s worse.",pcVar4);
    }
    set_itimeout(&u.uprops[0x1d].intrinsic,xtime);
    u._971_1_ = u._971_1_ & 0xfc | u._971_1_ & 3 | (byte)type & 3;
    iflags.botl = '\x01';
  }
  if (u.uprops[0x1d].intrinsic == 0) {
    u.usick_cause[0] = '\0';
  }
  else {
    exercise(4,'\0');
    if (cause == (char *)0x0) {
      u.usick_cause[0] = '\0';
    }
    else {
      strncpy(u.usick_cause,cause,0x53);
      u.usick_cause[0x52] = '\0';
    }
  }
  return;
}

Assistant:

void make_sick(long xtime, const char *cause, boolean talk, int type)
{
	long old = Sick;

	if (xtime > 0L) {
	    if (Sick_resistance) return;
	    if (!old) {
		/* newly sick */
		pline("You feel deathly sick.");
	    } else {
		/* already sick */
		if (talk) pline("You feel %s worse.",
			      xtime <= Sick/2L ? "much" : "even");
	    }
	    set_itimeout(&Sick, xtime);
	    u.usick_type |= type;
	    iflags.botl = TRUE;
	} else if (old && (type & u.usick_type)) {
	    /* was sick, now not */
	    u.usick_type &= ~type;
	    if (u.usick_type) { /* only partly cured */
		if (talk) pline("You feel somewhat better.");
		set_itimeout(&Sick, Sick * 2); /* approximation */
	    } else {
		if (talk) pline("What a relief!");
		Sick = 0L;		/* set_itimeout(&Sick, 0L) */
	    }
	    iflags.botl = TRUE;
	}

	if (Sick) {
	    exercise(A_CON, FALSE);
	    if (cause) {
		strncpy(u.usick_cause, cause, sizeof(u.usick_cause));
		u.usick_cause[sizeof(u.usick_cause)-1] = 0;
		}
	    else
		u.usick_cause[0] = 0;
	} else
	    u.usick_cause[0] = 0;
}